

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O3

void Abc_TtCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  word *pwVar7;
  ulong uVar8;
  
  uVar1 = (ulong)(uint)nVars;
  if (nVars < 7) {
    if (0 < nVars) {
      uVar3 = *pTruth;
      lVar4 = 0;
      do {
        uVar5 = *(ulong *)((long)s_Truths6Neg + lVar4) & uVar3;
        uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
        uVar5 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
        uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f0f0f0f0f;
        uVar5 = (uVar5 >> 8) + uVar5;
        lVar6 = (uVar5 >> 0x10) + uVar5;
        *pStore = (int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xff;
        pStore = (int *)((uint *)pStore + 1);
        lVar4 = lVar4 + 8;
      } while (uVar1 << 3 != lVar4);
    }
  }
  else {
    memset(pStore,0,uVar1 * 4);
    if (nVars + -6 != 0x1f) {
      lVar4 = 0;
      do {
        uVar3 = pTruth[lVar4];
        uVar5 = pTruth[lVar4 + 1];
        pwVar7 = s_Truths6Neg;
        lVar6 = 0;
        do {
          uVar8 = (uVar5 & *pwVar7) << ((byte)(1 << ((byte)lVar6 & 0x1f)) & 0x3f) | *pwVar7 & uVar3;
          if (uVar8 != 0) {
            uVar8 = uVar8 - (uVar8 >> 1 & 0x5555555555555555);
            uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
            uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
            uVar8 = (uVar8 >> 8) + uVar8;
            lVar2 = (uVar8 >> 0x10) + uVar8;
            pStore[lVar6] = pStore[lVar6] + ((int)((ulong)lVar2 >> 0x20) + (int)lVar2 & 0xffU);
          }
          lVar6 = lVar6 + 1;
          pwVar7 = pwVar7 + 1;
        } while (lVar6 != 6);
        if (uVar3 != 0) {
          uVar3 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
          uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
          uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
          uVar3 = (uVar3 >> 8) + uVar3;
          lVar6 = (uVar3 >> 0x10) + uVar3;
          lVar2 = 0;
          do {
            if (((uint)lVar4 >> ((uint)lVar2 & 0x1f) & 1) == 0) {
              pStore[lVar2 + 6] =
                   pStore[lVar2 + 6] + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
            }
            lVar2 = lVar2 + 1;
          } while (uVar1 - 6 != lVar2);
        }
        if (uVar5 != 0) {
          uVar5 = uVar5 - (uVar5 >> 1 & 0x5555555555555555);
          uVar3 = (uVar5 >> 2 & 0x3333333333333333) + (uVar5 & 0x3333333333333333);
          uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f;
          uVar3 = (uVar3 >> 8) + uVar3;
          lVar6 = (uVar3 >> 0x10) + uVar3;
          lVar2 = 0;
          do {
            if ((((uint)lVar4 | 1) >> ((uint)lVar2 & 0x1f) & 1) == 0) {
              pStore[lVar2 + 6] =
                   pStore[lVar2 + 6] + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
            }
            lVar2 = lVar2 + 1;
          } while (uVar1 - 6 != lVar2);
        }
        lVar4 = lVar4 + 2;
      } while (lVar4 < 1 << ((byte)(nVars + -6) & 0x1f));
    }
  }
  return;
}

Assistant:

static inline void Abc_TtCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    word Temp;
    int i, k, Counter, nWords;
    if ( nVars <= 6 )
    {
        for ( i = 0; i < nVars; i++ )
            pStore[i] = Abc_TtCountOnes( pTruth[0] & s_Truths6Neg[i] );
        return;
    }
    assert( nVars > 6 );
    nWords = Abc_TtWordNum( nVars );
    memset( pStore, 0, sizeof(int) * nVars );
    for ( k = 0; k < nWords; k++ )
    {
        // count 1's for the first six variables
        for ( i = 0; i < 6; i++ )
            if ( (Temp = (pTruth[k] & s_Truths6Neg[i]) | ((pTruth[k+1] & s_Truths6Neg[i]) << (1 << i))) )
                pStore[i] += Abc_TtCountOnes( Temp );
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
        k++;
        // count 1's for all other variables
        if ( pTruth[k] )
        {
            Counter = Abc_TtCountOnes( pTruth[k] );
            for ( i = 6; i < nVars; i++ )
                if ( (k & (1 << (i-6))) == 0 )
                    pStore[i] += Counter;
        }
    } 
}